

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O0

bool __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::ValidThreadAccess(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                    *this)

{
  ThreadContextId pvVar1;
  DWORD DVar2;
  ThreadContextId pvVar3;
  bool local_15;
  DWORD currentThreadId;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *this_local;
  
  DVar2 = GetCurrentThreadId();
  local_15 = true;
  if ((((this->disableThreadAccessCheck & 1U) == 0) &&
      ((this->concurrentThreadId != 0xffffffff ||
       (local_15 = true, this->threadContextHandle != (ThreadContextId)0x0)))) &&
     ((this->concurrentThreadId == 0xffffffff ||
      (local_15 = true, this->concurrentThreadId != DVar2)))) {
    pvVar1 = this->threadContextHandle;
    pvVar3 = GetCurrentThreadContextId();
    local_15 = pvVar1 == pvVar3;
  }
  return local_15;
}

Assistant:

bool ValidThreadAccess()
    {
        DWORD currentThreadId = ::GetCurrentThreadId();
        return disableThreadAccessCheck ||
            (this->concurrentThreadId == -1 && this->threadContextHandle == NULL) ||  // JIT thread after close
            (this->concurrentThreadId != -1 && this->concurrentThreadId == currentThreadId) ||
            this->threadContextHandle == GetCurrentThreadContextId();
    }